

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O2

void __thiscall Configurator::Configurator(Configurator *this,streambuf *out_buf)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,"",&local_11);
  std::ostream::ostream(&this->output,out_buf);
  return;
}

Assistant:

explicit Configurator(std::streambuf* out_buf) : output(out_buf) {}